

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::applyFilters
          (FilterCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *filters)

{
  pointer pMVar1;
  ostringstream *this_00;
  TestLog *log;
  pointer puVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer pMVar4;
  ostringstream *this_01;
  ulong uVar5;
  char *pcVar6;
  pointer puVar7;
  ulong uVar8;
  ScopedLogSection section;
  string local_208;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *local_1e8;
  ScopedLogSection local_1e0;
  long local_1d8;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  log = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  local_1e8 = filters;
  local_1b0._0_8_ = (TestLog *)(local_1b0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x98644f);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Setting message filters","")
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_1e0,log,(string *)local_1b0,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  iVar3 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  local_1d8 = CONCAT44(extraout_var,iVar3);
  pMVar4 = (local_1e8->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((local_1e8->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar4) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    uVar8 = 0;
    do {
      this_01 = (ostringstream *)(local_1b0 + 8);
      pMVar1 = pMVar4 + uVar8;
      if (pMVar4[uVar8].ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          pMVar4[uVar8].ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_1b0._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"Setting messages with",0x15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," source ",8);
        local_208._M_string_length._0_4_ = pMVar1->source;
        local_208._M_dataplus._M_p = (pointer)glu::getDebugMessageSourceName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_208,(ostream *)this_01);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", type ",7);
        local_1c0.m_value = pMVar1->type;
        local_1c0.m_getName = glu::getDebugMessageTypeName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_01);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," and severity ",0xe);
        local_1d0.m_value = pMVar1->severity;
        local_1d0.m_getName = glu::getDebugMessageSeverityName;
        tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_01);
        pcVar6 = " to disabled";
        if ((ulong)pMVar1->enabled != 0) {
          pcVar6 = " to enabled";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,pcVar6,0xc - (ulong)pMVar1->enabled);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
      }
      else if ((pMVar1->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_finish !=
               (pMVar1->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start) {
        uVar5 = 0;
        do {
          local_1b0._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Setting message (",0x11);
          local_208._M_dataplus._M_p = *(pointer *)pMVar1;
          local_208._M_string_length._0_4_ =
               (pMVar1->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start[uVar5];
          anon_unknown_1::operator<<((ostream *)this_00,(MessageID *)&local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") to ",5);
          pcVar6 = "Rendered image with GL_SAMPLE_MASK disabled";
          if ((ulong)pMVar1->enabled != 0) {
            pcVar6 = "Rendered image with GL_SAMPLE_MASK enabled";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,pcVar6 + 0x23,8 - (ulong)pMVar1->enabled);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(local_138);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)(pMVar1->ids).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pMVar1->ids).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      puVar2 = (pMVar1->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar5 = (long)(pMVar1->ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
      puVar7 = (pointer)0x0;
      if (uVar5 != 0) {
        puVar7 = puVar2;
      }
      (**(code **)(local_1d8 + 0x428))
                (pMVar1->source,pMVar1->type,pMVar1->severity,uVar5 >> 2,puVar7,pMVar1->enabled);
      uVar8 = uVar8 + 1;
      pMVar4 = (local_1e8->
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)(((long)(local_1e8->
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 4)
                            * -0x5555555555555555));
  }
  tcu::TestLog::endSection(local_1e0.m_log);
  return;
}

Assistant:

void FilterCase::applyFilters (const vector<MessageFilter>& filters) const
{
	TestLog&					log		= m_testCtx.getLog();
	const tcu::ScopedLogSection	section	(log, "", "Setting message filters");
	const glw::Functions&		gl		= m_context.getRenderContext().getFunctions();

	for (size_t filterNdx = 0; filterNdx < filters.size(); filterNdx++)
	{
		const MessageFilter& filter = filters[filterNdx];

		if (filter.ids.empty())
			log << TestLog::Message << "Setting messages with"
				<< " source " << glu::getDebugMessageSourceStr(filter.source)
				<< ", type " << glu::getDebugMessageTypeStr(filter.type)
				<< " and severity " << glu::getDebugMessageSeverityStr(filter.severity)
				<< (filter.enabled ? " to enabled" : " to disabled")
				<< TestLog::EndMessage;
		else
		{
			for (size_t ndx = 0; ndx < filter.ids.size(); ndx++)
				log << TestLog::Message << "Setting message (" << MessageID(filter.source, filter.type, filter.ids[ndx]) << ") to " << (filter.enabled ? "enabled" : "disabled") << TestLog::EndMessage;
		}

		gl.debugMessageControl(filter.source, filter.type, filter.severity, GLsizei(filter.ids.size()), filter.ids.empty() ? DE_NULL : &filter.ids[0], filter.enabled);
	}
}